

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printDescription
          (PrinterStream *this,vector<soul::Type,_std::allocator<soul::Type>_> *types)

{
  CodePrinter *pCVar1;
  bool bVar2;
  vector<soul::Type,_std::allocator<soul::Type>_> *this_00;
  bool bVar3;
  size_type sVar4;
  const_reference type_00;
  string local_88;
  reference local_68;
  Type *type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range2;
  bool first;
  string local_38;
  vector<soul::Type,_std::allocator<soul::Type>_> *local_18;
  vector<soul::Type,_std::allocator<soul::Type>_> *types_local;
  PrinterStream *this_local;
  
  local_18 = types;
  types_local = (vector<soul::Type,_std::allocator<soul::Type>_> *)this;
  sVar4 = std::vector<soul::Type,_std::allocator<soul::Type>_>::size(types);
  if (sVar4 == 1) {
    pCVar1 = this->out;
    type_00 = std::vector<soul::Type,_std::allocator<soul::Type>_>::operator[](local_18,0);
    getTypeDescription_abi_cxx11_(&local_38,this,type_00);
    choc::text::CodePrinter::operator<<(pCVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    choc::text::CodePrinter::operator<<(this->out,'(');
    this_00 = local_18;
    bVar2 = true;
    __end2 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin(local_18);
    type = (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end(this_00);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                                  *)&type);
      if (!bVar3) break;
      local_68 = __gnu_cxx::
                 __normal_iterator<const_soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                 ::operator*(&__end2);
      if (!bVar2) {
        choc::text::CodePrinter::operator<<(this->out,", ");
      }
      pCVar1 = this->out;
      getTypeDescription_abi_cxx11_(&local_88,this,local_68);
      choc::text::CodePrinter::operator<<(pCVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      bVar2 = false;
      __gnu_cxx::
      __normal_iterator<const_soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>::
      operator++(&__end2);
    }
    choc::text::CodePrinter::operator<<(this->out,')');
  }
  return;
}

Assistant:

void printDescription (const std::vector<Type>& types)
        {
            if (types.size() == 1)
            {
                out << getTypeDescription (types[0]);
                return;
            }

            out << '(';
            bool first = true;

            for (auto& type : types)
            {
                if (! first)
                    out << ", ";

                out << getTypeDescription (type);
                first = false;
            }

            out << ')';
        }